

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_log.c
# Opt level: O0

void zt_log_lstrerror(zt_log_ty *log,zt_log_level level,int errnum,char *fmt,...)

{
  char in_AL;
  size_t __n;
  void *__dest;
  char *pcVar1;
  char *in_RCX;
  int in_EDX;
  zt_log_level in_ESI;
  zt_log_ty *in_RDI;
  __va_list_tag *in_XMM1_Qa;
  char *in_XMM1_Qb;
  undefined8 in_XMM2_Qa;
  zt_log_ty *in_XMM2_Qb;
  char *nfmt;
  size_t llen;
  va_list ap;
  char *in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff1c;
  char *in_stack_ffffffffffffff20;
  __va_list_tag *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  zt_log_level level_00;
  zt_log_ty *in_stack_ffffffffffffff60;
  zt_log_ty *local_8;
  
  level_00 = (zt_log_level)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  if (in_AL != '\0') {
    in_stack_ffffffffffffff48 = in_XMM1_Qa;
    in_stack_ffffffffffffff50 = in_XMM1_Qb;
    in_stack_ffffffffffffff60 = in_XMM2_Qb;
    level_00 = (zt_log_level)((ulong)in_XMM2_Qa >> 0x20);
  }
  local_8 = in_RDI;
  if ((in_RDI == (zt_log_ty *)0x0) && (local_8 = zt_log_get_logger(), local_8 == (zt_log_ty *)0x0))
  {
    zt_log_set_debug_info
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff10);
    return;
  }
  if (local_8->level < in_ESI) {
    zt_log_set_debug_info
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff10);
  }
  else {
    __n = strlen(in_RCX);
    __dest = malloc(__n + 0x100);
    memcpy(__dest,in_RCX,__n);
    *(undefined1 *)((long)__dest + __n) = 0x3a;
    *(undefined1 *)((long)__dest + __n + 1) = 0x20;
    pcVar1 = strerror_r(in_EDX,(char *)((long)__dest + __n + 2),0xfd);
    if (pcVar1 != (char *)0x0) {
      zt_log_lprintf(local_8,zt_log_crit,"Could not capture error string");
    }
    zt_log_lvprintf(in_stack_ffffffffffffff60,level_00,in_stack_ffffffffffffff50,
                    in_stack_ffffffffffffff48);
    free(__dest);
  }
  return;
}

Assistant:

void
zt_log_lstrerror(zt_log_ty * log, zt_log_level level, int errnum, const char * fmt, ...) {
    va_list ap;
    size_t llen;
    char    * nfmt;

    if (!log && ((log = zt_log_get_logger()) == NULL)) {
        zt_log_set_debug_info(NULL, -1, NULL);
        return;
    }

    if (level > log->level) {
        zt_log_set_debug_info(NULL, -1, NULL);
        return;
    }

    llen           = strlen(fmt);


    nfmt           = (char*)malloc(llen + 256);
    memcpy(nfmt, fmt, llen);
    nfmt[llen]     = ':';
    nfmt[llen + 1] = ' ';

    if (strerror_r(errnum, nfmt + (llen + 2), 255 - 2) != 0) {
      zt_log_lprintf(log, zt_log_crit, "Could not capture error string");
    }

    va_start(ap, fmt);
    zt_log_lvprintf(log, level, nfmt, ap);
    va_end(ap);

    free(nfmt);
}